

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O2

void __thiscall wasm::FunctionValidator::visitRefCast(FunctionValidator *this,RefCast *curr)

{
  Type *this_00;
  bool bVar1;
  bool result;
  BasicHeapType left;
  BasicHeapType right;
  HeapType local_38;
  HeapType local_30;
  
  shouldBeTrue<wasm::RefCast*>
            (this,(bool)((byte)((((this->
                                  super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                                  ).
                                  super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                                  .
                                  super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                                 .currModule)->features).features >> 10) & 1),curr,
             "ref.cast requires gc [--enable-gc]");
  if ((curr->ref->type).id != 1) {
    bVar1 = wasm::Type::isRef(&curr->ref->type);
    bVar1 = shouldBeTrue<wasm::RefCast*>(this,bVar1,curr,"ref.cast ref must have ref type");
    if (bVar1) {
      this_00 = &(curr->super_SpecificExpression<(wasm::Expression::Id)58>).super_Expression.type;
      local_38 = wasm::Type::getHeapType(this_00);
      left = HeapType::getBottom(&local_38);
      local_30 = wasm::Type::getHeapType(&curr->ref->type);
      right = HeapType::getBottom(&local_30);
      shouldBeEqual<wasm::RefCast*,wasm::HeapType::BasicHeapType>
                (this,left,right,curr,
                 "ref.cast target type and ref type must have a common supertype");
      bVar1 = wasm::Type::isNullable(&curr->ref->type);
      result = true;
      if (!bVar1) {
        result = wasm::Type::isNonNullable(this_00);
      }
      shouldBeTrue<wasm::RefCast*>
                (this,result,curr,"ref.cast null of non-nullable references are not allowed");
    }
  }
  return;
}

Assistant:

void FunctionValidator::visitRefCast(RefCast* curr) {
  shouldBeTrue(
    getModule()->features.hasGC(), curr, "ref.cast requires gc [--enable-gc]");
  if (curr->ref->type == Type::unreachable) {
    return;
  }
  if (!shouldBeTrue(
        curr->ref->type.isRef(), curr, "ref.cast ref must have ref type")) {
    return;
  }
  shouldBeEqual(
    curr->type.getHeapType().getBottom(),
    curr->ref->type.getHeapType().getBottom(),
    curr,
    "ref.cast target type and ref type must have a common supertype");

  // We should never have a nullable cast of a non-nullable reference, since
  // that unnecessarily loses type information.
  shouldBeTrue(curr->ref->type.isNullable() || curr->type.isNonNullable(),
               curr,
               "ref.cast null of non-nullable references are not allowed");
}